

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

pointer __thiscall
pstore::json::parser<callbacks_proxy<mock_json_callbacks>>::
make_terminal_matcher<pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>>,std::__cxx11::string*,bool_const&>
          (parser<callbacks_proxy<mock_json_callbacks>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **args,bool *args_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined8 in_RCX;
  _Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  extraout_RDX;
  pointer pVar2;
  not_null<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_28;
  
  pbVar1 = *args;
  local_28.ptr_ = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)args_1;
  gsl::not_null<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
  ensure_invariant(&local_28);
  details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::string_matcher
            ((string_matcher<callbacks_proxy<mock_json_callbacks>_> *)&pbVar1[1].field_2,local_28,
             *(bool *)in_RCX);
  *this = (parser<callbacks_proxy<mock_json_callbacks>>)0x0;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)(this + 8) = &pbVar1[1].field_2;
  pVar2._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl = extraout_RDX._M_head_impl;
  pVar2._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._0_8_ = this;
  return (pointer)pVar2._M_t.
                  super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ;
}

Assistant:

auto parser<Callbacks>::make_terminal_matcher (Args &&... args) -> pointer {
            static_assert (sizeof (Matcher) <= sizeof (decltype (singletons_->terminal)),
                           "terminal storage is not large enough for Matcher type");
            static_assert (alignof (Matcher) <= alignof (decltype (singletons_->terminal)),
                           "terminal storage is not sufficiently aligned for Matcher type");

            return pointer (new (&singletons_->terminal) Matcher (std::forward<Args> (args)...),
                            typename pointer::deleter_type{false});
        }